

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O2

void __thiscall
TEST_WiningStateTest_BonusTiles_RedFives_Test::TEST_WiningStateTest_BonusTiles_RedFives_Test
          (TEST_WiningStateTest_BonusTiles_RedFives_Test *this)

{
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupWiningStateTest::TEST_GROUP_CppUTestGroupWiningStateTest
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest);
  (this->super_TEST_GROUP_CppUTestGroupWiningStateTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupWiningStateTest_001de6a0;
  return;
}

Assistant:

TEST(WiningStateTest, BonusTiles_RedFives)
{
	addPair(Tile::RedFiveOfBamboos);
	addSequence(Tile::FiveOfBamboos);
	addSequence(Tile::ThreeOfCharacters);
	addTriplet(Tile::SixOfCircles);
	addSequence(Tile::SevenOfCharacters);

	s.addBonusTile(Tile::FiveOfBamboos);

	selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SelfDrawn));
	CHECK_EQUAL(5, r.bonus_tile_count);
	CHECK_EQUAL(6, r.doubling_factor);
}